

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctcp.c
# Opt level: O2

void nn_ctcp_start_resolving(nn_ctcp *self)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *addr;
  undefined8 uVar4;
  int ipv4only;
  size_t ipv4onlylen;
  
  pcVar1 = nn_ep_getaddr(self->ep);
  pcVar2 = strchr(pcVar1,0x3b);
  pcVar3 = strrchr(pcVar1,0x3a);
  if (pcVar3 == (char *)0x0) {
    nn_backtrace_print();
    pcVar1 = "end";
    uVar4 = 0x1fd;
  }
  else {
    ipv4onlylen = 4;
    nn_ep_getopt(self->ep,0,0xe,&ipv4only,&ipv4onlylen);
    if (ipv4onlylen == 4) {
      addr = pcVar2 + 1;
      if (pcVar2 == (char *)0x0) {
        addr = pcVar1;
      }
      nn_dns_start(&self->dns,addr,(long)pcVar3 - (long)addr,ipv4only,&self->dns_result);
      self->state = 2;
      return;
    }
    nn_backtrace_print();
    pcVar1 = "ipv4onlylen == sizeof (ipv4only)";
    uVar4 = 0x203;
  }
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar1,
          "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/tcp/ctcp.c"
          ,uVar4);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_ctcp_start_resolving (struct nn_ctcp *self)
{
    const char *addr;
    const char *begin;
    const char *end;
    int ipv4only;
    size_t ipv4onlylen;

    /*  Extract the hostname part from address string. */
    addr = nn_ep_getaddr (self->ep);
    begin = strchr (addr, ';');
    if (!begin)
        begin = addr;
    else
        ++begin;
    end = strrchr (addr, ':');
    nn_assert (end);

    /*  Check whether IPv6 is to be used. */
    ipv4onlylen = sizeof (ipv4only);
    nn_ep_getopt (self->ep, NN_SOL_SOCKET, NN_IPV4ONLY,
        &ipv4only, &ipv4onlylen);
    nn_assert (ipv4onlylen == sizeof (ipv4only));

    /*  TODO: Get the actual value of IPV4ONLY option. */
    nn_dns_start (&self->dns, begin, end - begin, ipv4only, &self->dns_result);

    self->state = NN_CTCP_STATE_RESOLVING;
}